

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::CommandPool>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  int *piVar1;
  long *plVar2;
  Handle<(vk::HandleType)24> HVar3;
  deUint32 dVar4;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  size_t sVar7;
  deUint64 *pdVar8;
  long *plVar9;
  size_type __n;
  long lVar10;
  ulong uVar11;
  Unique<vk::Handle<(vk::HandleType)24>_> obj;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  VkCommandPool local_218;
  undefined1 auStack_210 [8];
  undefined8 local_208;
  VkAllocationCallbacks *pVStack_200;
  Move<vk::Handle<(vk::HandleType)24>_> local_1f8;
  VkDevice local_1d8;
  DeviceInterface *local_1d0;
  undefined1 local_1c8 [8];
  VkAllocationCallbacks aVStack_1c0 [2];
  ios_base local_150 [264];
  VkCommandPoolCreateInfo local_48;
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1c8,allocator,0x400);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  dVar4 = Context::getUniversalQueueFamilyIndex(context);
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1c8);
  local_48.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_48.pNext = (void *)0x0;
  local_48.flags = params.flags;
  local_48.queueFamilyIndex = dVar4;
  ::vk::createCommandPool(&local_1f8,vk,device,&local_48,aVStack_1c0);
  local_218.m_internal =
       local_1f8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  auStack_210 = (undefined1  [8])
                local_1f8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                m_deviceIface;
  local_208 = local_1f8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pVStack_200 = local_1f8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1c8);
  if (local_218.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)auStack_210,local_218);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1c8);
  sVar5 = getSafeObjectCount(context,sVar6 - sVar5,0);
  __n = 0x4000;
  if (sVar5 < 0x4000) {
    __n = sVar5;
  }
  local_1d0 = Context::getDeviceInterface(context);
  local_1d8 = Context::getDevice(context);
  dVar4 = Context::getUniversalQueueFamilyIndex(context);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
            *)&local_1f8,__n,(allocator_type *)local_1c8);
  local_1c8 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)aVStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)aVStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)24>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)aVStack_1c0 +
                    (int)((DeviceInterface *)((long)aVStack_1c0[0].pUserData + -0x18))->
                         _vptr_DeviceInterface);
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aVStack_1c0);
  std::ios_base::~ios_base(local_150);
  if (sVar5 != 0) {
    lVar10 = 8;
    uVar11 = 0;
    do {
      pdVar8 = (deUint64 *)operator_new(0x20);
      local_218.m_internal._0_4_ = 0x27;
      auStack_210 = (undefined1  [8])0x0;
      local_208 = (VkDevice)CONCAT44(dVar4,params.flags);
      ::vk::createCommandPool
                ((Move<vk::Handle<(vk::HandleType)24>_> *)local_1c8,local_1d0,local_1d8,
                 (VkCommandPoolCreateInfo *)&local_218,(VkAllocationCallbacks *)0x0);
      pdVar8[2] = (deUint64)aVStack_1c0[0].pfnAllocation;
      pdVar8[3] = (deUint64)aVStack_1c0[0].pfnReallocation;
      *pdVar8 = (deUint64)local_1c8;
      pdVar8[1] = (deUint64)aVStack_1c0[0].pUserData;
      local_1c8 = (undefined1  [8])0x0;
      aVStack_1c0[0].pUserData = (DeviceInterface *)0x0;
      aVStack_1c0[0].pfnAllocation = (PFN_vkAllocationFunction)0x0;
      aVStack_1c0[0].pfnReallocation = (PFN_vkReallocationFunction)0x0;
      plVar9 = (long *)operator_new(0x20);
      HVar3.m_internal =
           local_1f8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
      *(undefined4 *)(plVar9 + 1) = 0;
      *(undefined4 *)((long)plVar9 + 0xc) = 0;
      *plVar9 = (long)&PTR__SharedPtrState_00d538e0;
      plVar9[2] = (long)pdVar8;
      *(undefined4 *)(plVar9 + 1) = 1;
      *(undefined4 *)((long)plVar9 + 0xc) = 1;
      plVar2 = *(long **)(local_1f8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                          m_internal + lVar10);
      if (plVar2 != plVar9) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)
             ((long)(local_1f8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                     m_internal - 8) + lVar10) = 0;
            (**(code **)(**(long **)(local_1f8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
                                     .object.m_internal + lVar10) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)(HVar3.m_internal + lVar10) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (*(long **)(HVar3.m_internal + lVar10) != (long *)0x0) {
              (**(code **)(**(long **)(HVar3.m_internal + lVar10) + 8))();
            }
            *(undefined8 *)(HVar3.m_internal + lVar10) = 0;
          }
        }
        *(deUint64 **)((long)(HVar3.m_internal - 8) + lVar10) = pdVar8;
        *(long **)(HVar3.m_internal + lVar10) = plVar9;
        LOCK();
        *(int *)(plVar9 + 1) = (int)plVar9[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)(HVar3.m_internal + lVar10) + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar2 = plVar9 + 1;
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar9 + 0x10))(plVar9);
      }
      LOCK();
      piVar1 = (int *)((long)plVar9 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar9 + 8))(plVar9);
      }
      if (local_1c8 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)24>_> *)aVStack_1c0,(VkCommandPool)local_1c8)
        ;
      }
      if ((uVar11 & 0x3ff) == 0 && uVar11 != 0) {
        tcu::TestContext::touchWatchdog(context->m_testCtx);
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x10;
    } while (__n != uVar11);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
                     *)&local_1f8,
                    (pointer)local_1f8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                             m_internal);
  local_1c8 = (undefined1  [8])&aVStack_1c0[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1c8,
             (undefined1 *)((long)(_func_int ***)aVStack_1c0[0].pUserData + (long)local_1c8));
  if (local_1c8 != (undefined1  [8])&aVStack_1c0[0].pfnAllocation) {
    operator_delete((void *)local_1c8,(ulong)(aVStack_1c0[0].pfnAllocation + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
             *)&local_1f8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}